

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexDebug.cpp
# Opt level: O3

void debugDualChuzcFailNorms
               (HighsInt workCount,
               vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *workData,
               double *workDataNorm,HighsInt numVar,double *workDual,double *workDualNorm)

{
  double dVar1;
  pointer ppVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  
  *workDataNorm = 0.0;
  dVar5 = 0.0;
  if (0 < workCount) {
    ppVar2 = (workData->
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      dVar1 = *(double *)((long)&ppVar2->second + lVar4);
      dVar5 = dVar5 + dVar1 * dVar1;
      *workDataNorm = dVar5;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)workCount << 4 != lVar4);
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  *workDataNorm = dVar5;
  *workDualNorm = 0.0;
  dVar5 = 0.0;
  if (0 < numVar) {
    uVar3 = 0;
    do {
      dVar5 = dVar5 + workDual[uVar3] * workDual[uVar3];
      *workDualNorm = dVar5;
      uVar3 = uVar3 + 1;
    } while ((uint)numVar != uVar3);
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  *workDualNorm = dVar5;
  return;
}

Assistant:

void debugDualChuzcFailNorms(
    const HighsInt workCount,
    const std::vector<std::pair<HighsInt, double>>& workData,
    double& workDataNorm, const HighsInt numVar, const double* workDual,
    double& workDualNorm) {
  workDataNorm = 0;
  for (HighsInt i = 0; i < workCount; i++) {
    double value = workData[i].second;
    workDataNorm += value * value;
  }
  workDataNorm = sqrt(workDataNorm);
  workDualNorm = 0;
  for (HighsInt iVar = 0; iVar < numVar; iVar++) {
    double value = workDual[iVar];
    workDualNorm += value * value;
  }
  workDualNorm = sqrt(workDualNorm);
}